

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

TriQuadMesh * pbrt::TriQuadMesh::ReadPLY(TriQuadMesh *__return_storage_ptr__,string *filename)

{
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *this;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *this_00;
  int *piVar1;
  int iVar2;
  p_ply ply;
  p_ply_element last;
  long lVar3;
  int *piVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [64];
  long nInstances;
  FaceCallbackContext context;
  undefined8 local_98;
  size_type local_90;
  size_type local_88;
  string *local_80;
  int local_74;
  char *local_70 [2];
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> vStack_48;
  
  auVar8 = ZEXT1664(ZEXT816(0) << 0x40);
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->faceIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = auVar8;
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->uv).
    super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = auVar8;
  __return_storage_ptr__->p =
       (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>)auVar8._0_24_;
  __return_storage_ptr__->n =
       (vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>)auVar8._24_24_;
  (__return_storage_ptr__->uv).
  super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar8._48_8_;
  (__return_storage_ptr__->uv).
  super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar8._56_8_;
  ply = ply_open((filename->_M_dataplus)._M_p,rply_message_callback,0,(void *)0x0);
  local_80 = filename;
  if (ply == (p_ply)0x0) {
    pcVar5 = "Couldn\'t open PLY file \"%s\"";
  }
  else {
    iVar2 = ply_read_header(ply);
    if (iVar2 != 0) {
      last = (p_ply_element)0x0;
      local_88 = 0;
      local_90 = 0;
      while (last = ply_get_next_element(ply,last), last != (p_ply_element)0x0) {
        ply_get_element_info(last,local_70,&local_98);
        pcVar5 = local_70[0];
        iVar2 = strcmp(local_70[0],"vertex");
        if (iVar2 == 0) {
          local_88 = CONCAT44(local_98._4_4_,(int)local_98);
        }
        else {
          iVar2 = strcmp(pcVar5,"face");
          if (iVar2 == 0) {
            local_90 = CONCAT44(local_98._4_4_,(int)local_98);
          }
        }
      }
      pcVar5 = "%s: PLY file is invalid! No face/vertex elements found!";
      if ((local_88 != 0) && (local_90 != 0)) {
        std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::resize
                  (&__return_storage_ptr__->p,local_88);
        lVar3 = ply_set_read_cb(ply,"vertex","x",rply_vertex_callback,
                                (__return_storage_ptr__->p).
                                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,0x30);
        pcVar5 = "%s: Vertex coordinate property not found!";
        if ((lVar3 != 0) &&
           ((lVar3 = ply_set_read_cb(ply,"vertex","y",rply_vertex_callback,
                                     (__return_storage_ptr__->p).
                                     super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,0x31), lVar3 != 0 &&
            (lVar3 = ply_set_read_cb(ply,"vertex","z",rply_vertex_callback,
                                     (__return_storage_ptr__->p).
                                     super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,0x32), lVar3 != 0))))
        {
          this = &__return_storage_ptr__->n;
          std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::resize
                    (this,local_88);
          lVar3 = ply_set_read_cb(ply,"vertex","nx",rply_vertex_callback,
                                  (this->
                                  super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start,0x30);
          if (((lVar3 == 0) ||
              (lVar3 = ply_set_read_cb(ply,"vertex","ny",rply_vertex_callback,
                                       (this->
                                       super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start,0x31), lVar3 == 0)
              ) || (lVar3 = ply_set_read_cb(ply,"vertex","nz",rply_vertex_callback,
                                            (this->
                                            super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start,0x32),
                   lVar3 == 0)) {
            std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::resize
                      (this,0);
          }
          this_00 = &__return_storage_ptr__->uv;
          std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::resize
                    (this_00,local_88);
          lVar3 = ply_set_read_cb(ply,"vertex","u",rply_vertex_callback,
                                  (this_00->
                                  super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start,0x20);
          if (((((lVar3 == 0) ||
                (lVar3 = ply_set_read_cb(ply,"vertex","v",rply_vertex_callback,
                                         (this_00->
                                         super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start,0x21),
                lVar3 == 0)) &&
               ((lVar3 = ply_set_read_cb(ply,"vertex","s",rply_vertex_callback,
                                         (this_00->
                                         super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start,0x20),
                lVar3 == 0 ||
                (lVar3 = ply_set_read_cb(ply,"vertex","t",rply_vertex_callback,
                                         (this_00->
                                         super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start,0x21),
                lVar3 == 0)))) &&
              ((lVar3 = ply_set_read_cb(ply,"vertex","texture_u",rply_vertex_callback,
                                        (this_00->
                                        super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start,0x20), lVar3 == 0
               || (lVar3 = ply_set_read_cb(ply,"vertex","texture_v",rply_vertex_callback,
                                           (this_00->
                                           super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start,0x21),
                  lVar3 == 0)))) &&
             ((lVar3 = ply_set_read_cb(ply,"vertex","texture_s",rply_vertex_callback,
                                       (this_00->
                                       super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start,0x20), lVar3 == 0
              || (lVar3 = ply_set_read_cb(ply,"vertex","texture_t",rply_vertex_callback,
                                          (this_00->
                                          super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start,0x21),
                 lVar3 == 0)))) {
            std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::resize
                      (this_00,0);
          }
          vStack_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          vStack_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          vStack_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          std::vector<int,_std::allocator<int>_>::reserve(&local_60,local_90 * 3);
          std::vector<int,_std::allocator<int>_>::reserve(&vStack_48,local_90 * 4);
          lVar3 = ply_set_read_cb(ply,"face","vertex_indices",rply_face_callback,local_70,0);
          if (lVar3 == 0) {
            pcVar5 = "%s: vertex indices not found in PLY file";
          }
          else {
            lVar3 = ply_set_read_cb(ply,"face","face_indices",rply_faceindex_callback,
                                    &__return_storage_ptr__->faceIndices,0);
            if (lVar3 != 0) {
              std::vector<int,_std::allocator<int>_>::reserve
                        (&__return_storage_ptr__->faceIndices,local_90);
            }
            iVar2 = ply_read(ply);
            if (iVar2 != 0) {
              std::vector<int,_std::allocator<int>_>::_M_move_assign
                        (&__return_storage_ptr__->triIndices,&local_60);
              std::vector<int,_std::allocator<int>_>::_M_move_assign
                        (&__return_storage_ptr__->quadIndices,&vStack_48);
              ply_close(ply);
              piVar4 = (__return_storage_ptr__->triIndices).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start;
              piVar1 = (__return_storage_ptr__->triIndices).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_finish;
              if (piVar4 != piVar1) {
                uVar6 = ((long)(__return_storage_ptr__->p).
                               super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(__return_storage_ptr__->p).
                               super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555
                ;
                do {
                  local_98._0_4_ = *piVar4;
                  uVar7 = (ulong)(int)local_98;
                  if (((long)uVar7 < 0) || (uVar6 < uVar7 || uVar6 - uVar7 == 0)) {
                    local_74 = (int)((ulong)((long)(__return_storage_ptr__->p).
                                                                                                      
                                                  super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(__return_storage_ptr__->p).
                                                  super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                               -0x55555555;
                    ErrorExit<int&,int>("plymesh: Vertex index %i is out of bounds! Valid range is [0..%i)"
                                        ,(int *)&local_98,&local_74);
                  }
                  piVar4 = piVar4 + 1;
                } while (piVar4 != piVar1);
              }
              piVar4 = (__return_storage_ptr__->quadIndices).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start;
              piVar1 = (__return_storage_ptr__->quadIndices).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_finish;
              if (piVar4 != piVar1) {
                uVar6 = ((long)(__return_storage_ptr__->p).
                               super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(__return_storage_ptr__->p).
                               super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555
                ;
                do {
                  local_98._0_4_ = *piVar4;
                  uVar7 = (ulong)(int)local_98;
                  if (((long)uVar7 < 0) || (uVar6 < uVar7 || uVar6 - uVar7 == 0)) {
                    local_74 = (int)((ulong)((long)(__return_storage_ptr__->p).
                                                                                                      
                                                  super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(__return_storage_ptr__->p).
                                                  super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                               -0x55555555;
                    ErrorExit<int&,int>("plymesh: Vertex index %i is out of bounds! Valid range is [0..%i)"
                                        ,(int *)&local_98,&local_74);
                  }
                  piVar4 = piVar4 + 1;
                } while (piVar4 != piVar1);
              }
              if (vStack_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(vStack_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)vStack_48.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)vStack_48.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_end_of_storage -
                                (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start);
              }
              return __return_storage_ptr__;
            }
            pcVar5 = "%s: unable to read the contents of PLY file";
          }
          ErrorExit<std::__cxx11::string_const&>(pcVar5,local_80);
        }
      }
      ErrorExit<std::__cxx11::string_const&>(pcVar5,local_80);
    }
    pcVar5 = "Unable to read the header of PLY file \"%s\"";
  }
  ErrorExit<std::__cxx11::string_const&>(pcVar5,local_80);
}

Assistant:

TriQuadMesh TriQuadMesh::ReadPLY(const std::string &filename) {
    TriQuadMesh mesh;

    p_ply ply = ply_open(filename.c_str(), rply_message_callback, 0, nullptr);
    if (ply == nullptr)
        ErrorExit("Couldn't open PLY file \"%s\"", filename);

    if (ply_read_header(ply) == 0)
        ErrorExit("Unable to read the header of PLY file \"%s\"", filename);

    p_ply_element element = nullptr;
    size_t vertexCount = 0, faceCount = 0;

    /* Inspect the structure of the PLY file */
    while ((element = ply_get_next_element(ply, element)) != nullptr) {
        const char *name;
        long nInstances;

        ply_get_element_info(element, &name, &nInstances);
        if (strcmp(name, "vertex") == 0)
            vertexCount = nInstances;
        else if (strcmp(name, "face") == 0)
            faceCount = nInstances;
    }

    if (vertexCount == 0 || faceCount == 0)
        ErrorExit("%s: PLY file is invalid! No face/vertex elements found!", filename);

    mesh.p.resize(vertexCount);
    if (ply_set_read_cb(ply, "vertex", "x", rply_vertex_callback, mesh.p.data(), 0x30) ==
            0 ||
        ply_set_read_cb(ply, "vertex", "y", rply_vertex_callback, mesh.p.data(), 0x31) ==
            0 ||
        ply_set_read_cb(ply, "vertex", "z", rply_vertex_callback, mesh.p.data(), 0x32) ==
            0) {
        ErrorExit("%s: Vertex coordinate property not found!", filename);
    }

    mesh.n.resize(vertexCount);
    if (ply_set_read_cb(ply, "vertex", "nx", rply_vertex_callback, mesh.n.data(), 0x30) ==
            0 ||
        ply_set_read_cb(ply, "vertex", "ny", rply_vertex_callback, mesh.n.data(), 0x31) ==
            0 ||
        ply_set_read_cb(ply, "vertex", "nz", rply_vertex_callback, mesh.n.data(), 0x32) ==
            0)
        mesh.n.resize(0);

    /* There seem to be lots of different conventions regarding UV coordinate
     * names */
    mesh.uv.resize(vertexCount);
    if (((ply_set_read_cb(ply, "vertex", "u", rply_vertex_callback, mesh.uv.data(),
                          0x20) != 0) &&
         (ply_set_read_cb(ply, "vertex", "v", rply_vertex_callback, mesh.uv.data(),
                          0x21) != 0)) ||
        ((ply_set_read_cb(ply, "vertex", "s", rply_vertex_callback, mesh.uv.data(),
                          0x20) != 0) &&
         (ply_set_read_cb(ply, "vertex", "t", rply_vertex_callback, mesh.uv.data(),
                          0x21) != 0)) ||
        ((ply_set_read_cb(ply, "vertex", "texture_u", rply_vertex_callback,
                          mesh.uv.data(), 0x20) != 0) &&
         (ply_set_read_cb(ply, "vertex", "texture_v", rply_vertex_callback,
                          mesh.uv.data(), 0x21) != 0)) ||
        ((ply_set_read_cb(ply, "vertex", "texture_s", rply_vertex_callback,
                          mesh.uv.data(), 0x20) != 0) &&
         (ply_set_read_cb(ply, "vertex", "texture_t", rply_vertex_callback,
                          mesh.uv.data(), 0x21) != 0)))
        ;
    else
        mesh.uv.resize(0);

    FaceCallbackContext context;
    context.triIndices.reserve(faceCount * 3);
    context.quadIndices.reserve(faceCount * 4);
    if (ply_set_read_cb(ply, "face", "vertex_indices", rply_face_callback, &context, 0) ==
        0)
        ErrorExit("%s: vertex indices not found in PLY file", filename);

    if (ply_set_read_cb(ply, "face", "face_indices", rply_faceindex_callback,
                        &mesh.faceIndices, 0) != 0)
        mesh.faceIndices.reserve(faceCount);

    if (ply_read(ply) == 0)
        ErrorExit("%s: unable to read the contents of PLY file", filename);

    mesh.triIndices = std::move(context.triIndices);
    mesh.quadIndices = std::move(context.quadIndices);

    ply_close(ply);

    for (int idx : mesh.triIndices)
        if (idx < 0 || idx >= mesh.p.size())
            ErrorExit("plymesh: Vertex index %i is out of bounds! "
                      "Valid range is [0..%i)",
                      idx, int(mesh.p.size()));
    for (int idx : mesh.quadIndices)
        if (idx < 0 || idx >= mesh.p.size())
            ErrorExit("plymesh: Vertex index %i is out of bounds! "
                      "Valid range is [0..%i)",
                      idx, int(mesh.p.size()));

    return mesh;
}